

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

UString * jsonnet::internal::jsonnet_string_unparse(UString *str,bool single)

{
  UString *in_RDI;
  UStringStream ss;
  bool in_stack_000001d7;
  UString *in_stack_000001d8;
  undefined4 in_stack_ffffffffffffff78;
  char32_t in_stack_ffffffffffffff7c;
  UString *this;
  
  this = in_RDI;
  UStringStream::UStringStream((UStringStream *)0x20fcd8);
  UStringStream::operator<<((UStringStream *)this,in_stack_ffffffffffffff7c);
  jsonnet_string_escape(in_stack_000001d8,in_stack_000001d7);
  UStringStream::operator<<
            ((UStringStream *)this,
             (UString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::__cxx11::u32string::~u32string(this);
  UStringStream::operator<<((UStringStream *)this,in_stack_ffffffffffffff7c);
  UStringStream::str_abi_cxx11_
            ((UStringStream *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  UStringStream::~UStringStream((UStringStream *)0x20fd5b);
  return in_RDI;
}

Assistant:

UString jsonnet_string_unparse(const UString &str, bool single)
{
    UStringStream ss;
    ss << (single ? U'\'' : U'\"');
    ss << jsonnet_string_escape(str, single);
    ss << (single ? U'\'' : U'\"');
    return ss.str();
}